

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O1

int ffgtch(fitsfile *gfptr,int grouptype,int *status)

{
  long lVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  int locationCol;
  int uriCol;
  int extverCol;
  int extnameCol;
  long tfields;
  int xtensionCol;
  int colnum;
  int positionCol;
  int ncols;
  int grptype;
  char *ttype [6];
  char *tform [6];
  char comment [73];
  char tformBuff [54];
  char keyvalue [71];
  char keyword [75];
  char ttypeBuff [102];
  
  ncols = 0;
  colnum = 0;
  grptype = 0;
  tfields = 0;
  if (*status != 0) {
    return *status;
  }
  pcVar4 = tformBuff;
  pcVar5 = ttypeBuff;
  lVar6 = 0;
  do {
    ttype[lVar6] = pcVar5;
    tform[lVar6] = pcVar4;
    lVar6 = lVar6 + 1;
    pcVar4 = pcVar4 + 9;
    pcVar5 = pcVar5 + 0x11;
  } while (lVar6 != 6);
  iVar2 = ffgtgc(gfptr,&xtensionCol,&extnameCol,&extverCol,&positionCol,&locationCol,&uriCol,
                 &grptype,status);
  *status = iVar2;
  if (iVar2 != 0) goto LAB_001b75f7;
  iVar2 = ffgkyj(gfptr,"TFIELDS",&tfields,comment,status);
  *status = iVar2;
  iVar2 = ffgtdc(grouptype,xtensionCol,extnameCol,extverCol,positionCol,locationCol,uriCol,ttype,
                 tform,&ncols,status);
  *status = iVar2;
  switch(grouptype) {
  case 0:
    break;
  case 1:
    if (positionCol != 0) {
      iVar2 = ffdcol(gfptr,positionCol,status);
      *status = iVar2;
      tfields = tfields + -1;
      if (positionCol < uriCol) {
        uriCol = uriCol + -1;
      }
      if (positionCol < locationCol) {
        locationCol = locationCol + -1;
      }
    }
    if (uriCol != 0) {
      iVar2 = ffdcol(gfptr,uriCol,status);
      *status = iVar2;
      tfields = tfields + -1;
      if (uriCol < locationCol) {
        locationCol = locationCol + -1;
      }
    }
    if (locationCol != 0) {
      iVar2 = ffdcol(gfptr,locationCol,status);
      *status = iVar2;
    }
    break;
  case 2:
    if (xtensionCol != 0) {
      iVar2 = ffdcol(gfptr,xtensionCol,status);
      *status = iVar2;
      tfields = tfields + -1;
      if (xtensionCol < extnameCol) {
        extnameCol = extnameCol + -1;
      }
      if (xtensionCol < extverCol) {
        extverCol = extverCol + -1;
      }
      if (xtensionCol < uriCol) {
        uriCol = uriCol + -1;
      }
      if (xtensionCol < locationCol) {
        locationCol = locationCol + -1;
      }
    }
    if (extnameCol != 0) {
      iVar2 = ffdcol(gfptr,extnameCol,status);
      *status = iVar2;
      tfields = tfields + -1;
      if (extnameCol < extverCol) {
        extverCol = extverCol + -1;
      }
      if (extnameCol < uriCol) {
        uriCol = uriCol + -1;
      }
      if (extnameCol < locationCol) {
        locationCol = locationCol + -1;
      }
    }
    if (extverCol != 0) {
      iVar2 = ffdcol(gfptr,extverCol,status);
      *status = iVar2;
      tfields = tfields + -1;
      if (extverCol < uriCol) {
        uriCol = uriCol + -1;
      }
      if (extverCol < locationCol) {
        locationCol = locationCol + -1;
      }
    }
  case 3:
    positionCol = locationCol;
    if (uriCol != 0) {
      iVar2 = ffdcol(gfptr,uriCol,status);
      *status = iVar2;
      tfields = tfields + -1;
      positionCol = locationCol;
      if (uriCol < locationCol) {
        positionCol = locationCol + -1;
        locationCol = positionCol;
      }
    }
    goto LAB_001b788c;
  default:
    *status = 0x15b;
    ffpmsg("Invalid value for grouptype parameter specified (ffgtch)");
    break;
  case 0xb:
    goto LAB_001b788c;
  case 0xc:
    if (xtensionCol != 0) {
      iVar2 = ffdcol(gfptr,xtensionCol,status);
      *status = iVar2;
      tfields = tfields + -1;
      if (xtensionCol < extnameCol) {
        extnameCol = extnameCol + -1;
      }
      if (xtensionCol < extverCol) {
        extverCol = extverCol + -1;
      }
    }
    positionCol = extverCol;
    if (extnameCol != 0) {
      iVar2 = ffdcol(gfptr,extnameCol,status);
      *status = iVar2;
      tfields = tfields + -1;
      positionCol = extverCol;
      if (extnameCol < extverCol) {
        positionCol = extverCol + -1;
        extverCol = positionCol;
      }
    }
LAB_001b788c:
    if (positionCol != 0) {
      iVar2 = ffdcol(gfptr,positionCol,status);
      *status = iVar2;
      tfields = tfields + -1;
    }
  }
  iVar2 = ncols;
  lVar6 = (long)ncols;
  if (0 < lVar6) {
    lVar7 = 0;
    do {
      if (*status != 0) break;
      lVar1 = lVar7 + 1;
      iVar3 = fficol(gfptr,(int)lVar7 + (int)tfields + 1,ttype[lVar7],tform[lVar7],status);
      *status = iVar3;
      lVar7 = lVar1;
    } while (lVar6 != lVar1);
  }
  if (0 < iVar2) {
    lVar7 = 0;
    do {
      if (*status != 0) break;
      pcVar4 = ttype[lVar7];
      iVar2 = fits_strcasecmp(pcVar4,"MEMBER_POSITION");
      if ((iVar2 == 0) || (iVar2 = fits_strcasecmp(pcVar4,"MEMBER_VERSION"), iVar2 == 0)) {
        iVar2 = ffgcno(gfptr,1,pcVar4,&colnum,status);
        *status = iVar2;
        snprintf(keyword,0x4b,"TFORM%d",(ulong)(uint)colnum);
        iVar2 = ffgkys(gfptr,keyword,keyvalue,comment,status);
        *status = iVar2;
        snprintf(keyword,0x4b,"TNULL%d",(ulong)(uint)colnum);
        iVar2 = ffikyj(gfptr,keyword,0,"Column Null Value",status);
LAB_001b7a1d:
        *status = iVar2;
      }
      else {
        iVar2 = fits_strcasecmp(pcVar4,"MEMBER_XTENSION");
        if ((((iVar2 == 0) || (iVar2 = fits_strcasecmp(pcVar4,"MEMBER_NAME"), iVar2 == 0)) ||
            (iVar2 = fits_strcasecmp(pcVar4,"MEMBER_URI_TYPE"), iVar2 == 0)) ||
           (iVar2 = fits_strcasecmp(pcVar4,"MEMBER_LOCATION"), iVar2 == 0)) {
          iVar2 = ffgcno(gfptr,1,pcVar4,&colnum,status);
          goto LAB_001b7a1d;
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
  }
LAB_001b75f7:
  return *status;
}

Assistant:

int ffgtch(fitsfile *gfptr,     /* FITS pointer to group                     */
	   int       grouptype, /* code specifying the type of
				   grouping table information:
				   GT_ID_ALL_URI  0 ==> defualt (all columns)
				   GT_ID_REF      1 ==> ID by reference
				   GT_ID_POS      2 ==> ID by position
				   GT_ID_ALL      3 ==> ID by ref. and position
				   GT_ID_REF_URI 11 ==> (1) + URI info 
				   GT_ID_POS_URI 12 ==> (2) + URI info       */
	   int      *status)     /* return status code                       */


/* 
   Change the grouping table structure of the grouping table pointed to by
   gfptr. The grouptype code specifies the new structure of the table. This
   operation only adds or removes grouping table columns, it does not add
   or delete group members (i.e., table rows). If the grouping table already
   has the desired structure then no operations are performed and function   
   simply returns with a (0) success status code. If the requested structure
   change creates new grouping table columns, then the column values for all
   existing members will be filled with the appropriate null values.
*/

{
  int xtensionCol, extnameCol, extverCol, positionCol, locationCol, uriCol;
  int ncols    = 0;
  int colnum   = 0;
  int nrows    = 0;
  int grptype  = 0;
  int i,j;

  long intNull  = 0;
  long tfields  = 0;
  
  char *tform[6];
  char *ttype[6];

  unsigned char  charNull[1] = {'\0'};

  char ttypeBuff[102];  
  char tformBuff[54];  

  char  keyword[FLEN_KEYWORD];
  char  keyvalue[FLEN_VALUE];
  char  comment[FLEN_COMMENT];


  if(*status != 0) return(*status);

  do
    {
      /* set up the ttype and tform character buffers */

      for(i = 0; i < 6; ++i)
	{
	  ttype[i] = ttypeBuff+(i*17);
	  tform[i] = tformBuff+(i*9);
	}

      /* retrieve positions of all Grouping table reserved columns */

      *status = ffgtgc(gfptr,&xtensionCol,&extnameCol,&extverCol,&positionCol,
		       &locationCol,&uriCol,&grptype,status);

      if(*status != 0) continue;

      /* determine the total number of grouping table columns */

      *status = fits_read_key_lng(gfptr,"TFIELDS",&tfields,comment,status);

      /* define grouping table columns to be added to the configuration */

      *status = ffgtdc(grouptype,xtensionCol,extnameCol,extverCol,positionCol,
		       locationCol,uriCol,ttype,tform,&ncols,status);

      /*
	delete any grouping tables columns that exist but do not belong to
	new desired configuration; note that we delete before creating new
	columns for (file size) efficiency reasons
      */

      switch(grouptype)
	{

	case GT_ID_ALL_URI:

	  /* no columns to be deleted in this case */

	  break;

	case GT_ID_REF:

	  if(positionCol != 0) 
	    {
	      *status = fits_delete_col(gfptr,positionCol,status);
	      --tfields;
	      if(uriCol      > positionCol)  --uriCol;
	      if(locationCol > positionCol) --locationCol;
	    }
	  if(uriCol      != 0)
	    { 
	    *status = fits_delete_col(gfptr,uriCol,status);
	      --tfields;
	      if(locationCol > uriCol) --locationCol;
	    }
	  if(locationCol != 0) 
	    *status = fits_delete_col(gfptr,locationCol,status);

	  break;

	case  GT_ID_POS:

	  if(xtensionCol != 0) 
	    {
	      *status = fits_delete_col(gfptr,xtensionCol,status);
	      --tfields;
	      if(extnameCol  > xtensionCol)  --extnameCol;
	      if(extverCol   > xtensionCol)  --extverCol;
	      if(uriCol      > xtensionCol)  --uriCol;
	      if(locationCol > xtensionCol)  --locationCol;
	    }
	  if(extnameCol  != 0) 
	    {
	      *status = fits_delete_col(gfptr,extnameCol,status);
	      --tfields;
	      if(extverCol   > extnameCol)  --extverCol;
	      if(uriCol      > extnameCol)  --uriCol;
	      if(locationCol > extnameCol)  --locationCol;
	    }
	  if(extverCol   != 0)
	    { 
	      *status = fits_delete_col(gfptr,extverCol,status);
	      --tfields;
	      if(uriCol      > extverCol)  --uriCol;
	      if(locationCol > extverCol)  --locationCol;
	    }
	  if(uriCol      != 0)
	    { 
	      *status = fits_delete_col(gfptr,uriCol,status);
	      --tfields;
	      if(locationCol > uriCol)  --locationCol;
	    }
	  if(locationCol != 0)
	    { 
	      *status = fits_delete_col(gfptr,locationCol,status);
	      --tfields;
	    }
	  
	  break;

	case  GT_ID_ALL:

	  if(uriCol      != 0) 
	    {
	      *status = fits_delete_col(gfptr,uriCol,status);
	      --tfields;
	      if(locationCol > uriCol)  --locationCol;
	    }
	  if(locationCol != 0)
	    { 
	      *status = fits_delete_col(gfptr,locationCol,status);
	      --tfields;
	    }

	  break;

	case GT_ID_REF_URI:

	  if(positionCol != 0)
	    { 
	      *status = fits_delete_col(gfptr,positionCol,status);
	      --tfields;
	    }

	  break;

	case  GT_ID_POS_URI:

	  if(xtensionCol != 0) 
	    {
	      *status = fits_delete_col(gfptr,xtensionCol,status);
	      --tfields;
	      if(extnameCol > xtensionCol)  --extnameCol;
	      if(extverCol  > xtensionCol)  --extverCol;
	    }
	  if(extnameCol  != 0)
	    { 
	      *status = fits_delete_col(gfptr,extnameCol,status);
	      --tfields;
	      if(extverCol > extnameCol)  --extverCol;
	    }
	  if(extverCol   != 0)
	    { 
	      *status = fits_delete_col(gfptr,extverCol,status);
	      --tfields;
	    }

	  break;

	default:

	  *status = BAD_OPTION;
	  ffpmsg("Invalid value for grouptype parameter specified (ffgtch)");
	  break;

	}

      /*
	add all the new grouping table columns that were not there
	previously but are called for by the grouptype parameter
      */

      for(i = 0; i < ncols && *status == 0; ++i)
	*status = fits_insert_col(gfptr,tfields+i+1,ttype[i],tform[i],status);

      /* 
	 add the TNULL keywords and values for each new integer column defined;
	 integer null values are zero (0) for the MEMBER_POSITION and 
	 MEMBER_VERSION columns. Insert a null ("/0") into each new string
	 column defined: MEMBER_XTENSION, MEMBER_NAME, MEMBER_URI_TYPE and
	 MEMBER_LOCATION. Note that by convention a null string is the
	 TNULL value for character fields so no TNULL is required.
      */

      for(i = 0; i < ncols && *status == 0; ++i)
	{	  
	  if(fits_strcasecmp(ttype[i],"MEMBER_POSITION") == 0 ||
	     fits_strcasecmp(ttype[i],"MEMBER_VERSION")  == 0)
	    {
	      /* col contains int data; set TNULL and insert 0 for each col */

	      *status = fits_get_colnum(gfptr,CASESEN,ttype[i],&colnum,
					status);
	      
	      snprintf(keyword,FLEN_KEYWORD,"TFORM%d",colnum);

	      *status = fits_read_key_str(gfptr,keyword,keyvalue,comment,
					  status);
	 
	      snprintf(keyword,FLEN_KEYWORD,"TNULL%d",colnum);

	      *status = fits_insert_key_lng(gfptr,keyword,0,
					    "Column Null Value",status);

	      for(j = 1; j <= nrows && *status == 0; ++j)
		*status = fits_write_col_lng(gfptr,colnum,j,1,1,&intNull,
					     status);
	    }
	  else if(fits_strcasecmp(ttype[i],"MEMBER_XTENSION") == 0 ||
		  fits_strcasecmp(ttype[i],"MEMBER_NAME")     == 0 ||
		  fits_strcasecmp(ttype[i],"MEMBER_URI_TYPE") == 0 ||
		  fits_strcasecmp(ttype[i],"MEMBER_LOCATION") == 0)
	    {

	      /* new col contains character data; insert NULLs into each col */

	      *status = fits_get_colnum(gfptr,CASESEN,ttype[i],&colnum,
					status);

	      for(j = 1; j <= nrows && *status == 0; ++j)
	    /* WILL THIS WORK FOR VAR LENTH CHAR COLS??????*/
		*status = fits_write_col_byt(gfptr,colnum,j,1,1,charNull,
					     status);
	    }
	}

    }while(0);

  return(*status);
}